

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_mark_prism_by_ratio(REF_SUBDIV ref_subdiv,REF_DBL *node_ratio)

{
  REF_CELL pRVar1;
  uint uVar2;
  double dVar3;
  int iStack_68;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT pri_tri_cell_edge [6];
  int local_44;
  REF_INT tri_cell_edge;
  REF_DBL ratio_limit;
  REF_INT node1;
  REF_INT node0;
  REF_INT cell_edge;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_DBL *node_ratio_local;
  REF_SUBDIV ref_subdiv_local;
  
  pRVar1 = ref_subdiv->grid->cell[10];
  _iStack_68 = 0x100000000;
  pri_tri_cell_edge[0] = 3;
  pri_tri_cell_edge[1] = 6;
  pri_tri_cell_edge[2] = 7;
  pri_tri_cell_edge[3] = 8;
  dVar3 = sqrt(2.0);
  node0 = 0;
  do {
    if (pRVar1->max <= node0) {
      return 0;
    }
    if (((-1 < node0) && (node0 < pRVar1->max)) && (pRVar1->c2n[pRVar1->size_per * node0] != -1)) {
      for (local_44 = 0; local_44 < 6; local_44 = local_44 + 1) {
        if (((node_ratio
              [pRVar1->c2n[pRVar1->e2n[(&iStack_68)[local_44] << 1] + pRVar1->size_per * node0]] <
              dVar3 * 0.5) &&
            (node_ratio
             [pRVar1->c2n[pRVar1->e2n[(&iStack_68)[local_44] * 2 + 1] + pRVar1->size_per * node0]] <
             dVar3 * 0.5)) &&
           (uVar2 = ref_subdiv_mark_to_split
                              (ref_subdiv,
                               pRVar1->c2n
                               [pRVar1->e2n[(&iStack_68)[local_44] << 1] + pRVar1->size_per * node0]
                               ,pRVar1->c2n
                                [pRVar1->e2n[(&iStack_68)[local_44] * 2 + 1] +
                                 pRVar1->size_per * node0]), uVar2 != 0)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x10d,"ref_subdiv_mark_prism_by_ratio",(ulong)uVar2,"sp");
          return uVar2;
        }
      }
    }
    node0 = node0 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_prism_by_ratio(REF_SUBDIV ref_subdiv,
                                                  REF_DBL *node_ratio) {
  REF_CELL ref_cell = ref_grid_pri(ref_subdiv_grid(ref_subdiv));
  REF_INT cell, cell_edge;
  REF_INT node0, node1;
  REF_DBL ratio_limit;

  REF_INT tri_cell_edge;
  REF_INT pri_tri_cell_edge[] = {0, 1, 3, 6, 7, 8};

  ratio_limit = 0.5 * sqrt(2.0);

  each_ref_cell_valid_cell(ref_cell, cell) {
    for (tri_cell_edge = 0; tri_cell_edge < 6; tri_cell_edge++) {
      cell_edge = pri_tri_cell_edge[tri_cell_edge];
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (node_ratio[node0] < ratio_limit && node_ratio[node1] < ratio_limit)
        RSS(ref_subdiv_mark_to_split(ref_subdiv, node0, node1), "sp");
    }
  }

  return REF_SUCCESS;
}